

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_7::Validator::CheckMemoryVar(Validator *this,Var *var,Memory **out_memory)

{
  bool bVar1;
  Result result;
  size_type sVar2;
  const_reference ppMVar3;
  uint local_2c;
  Memory **ppMStack_28;
  Index index;
  Memory **out_memory_local;
  Var *var_local;
  Validator *this_local;
  
  ppMStack_28 = out_memory;
  out_memory_local = (Memory **)var;
  var_local = (Var *)this;
  sVar2 = std::vector<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>::size
                    (&this->current_module_->memories);
  result = CheckVar(this,(Index)sVar2,(Var *)out_memory_local,"memory",&local_2c);
  bVar1 = Failed(result);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    if (ppMStack_28 != (Memory **)0x0) {
      ppMVar3 = std::vector<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>::operator[]
                          (&this->current_module_->memories,(ulong)local_2c);
      *ppMStack_28 = *ppMVar3;
    }
    Result::Result((Result *)((long)&this_local + 4),Ok);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result Validator::CheckMemoryVar(const Var* var, const Memory** out_memory) {
  Index index;
  CHECK_RESULT(
      CheckVar(current_module_->memories.size(), var, "memory", &index));
  if (out_memory) {
    *out_memory = current_module_->memories[index];
  }
  return Result::Ok;
}